

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::to_string_abi_cxx11_
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  container_type *in_RDI;
  basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  encoder;
  string_type2 *s;
  basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *this_00;
  allocator<char> local_199;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198 [2];
  basic_json_visitor<char> *in_stack_fffffffffffffe78;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_ffffffffffffff70;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffff80;
  
  std::__cxx11::string::string((string *)in_RDI);
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  string_sink(local_198,in_RDI);
  this_00 = (basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
             *)&local_199;
  std::allocator<char>::allocator();
  basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::basic_compact_json_encoder
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator(&local_199);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~basic_compact_json_encoder(this_00);
  return in_RDI;
}

Assistant:

std::basic_string<char_type> to_string() const noexcept
        {
            using string_type2 = std::basic_string<char_type>;
            string_type2 s;
            basic_compact_json_encoder<char_type, jsoncons::string_sink<string_type2>> encoder(s);
            dump(encoder);
            return s;
        }